

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibi.cpp
# Opt level: O3

bool find_chibi_build_root(char *source_path,char *build_root,int build_root_size)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  char current_path [4096];
  char root_path [4096];
  char local_2038 [4096];
  char local_1038;
  char acStack_1037 [4103];
  
  pcVar6 = local_2038;
  cVar5 = *source_path;
  if (cVar5 != '\0') {
    lVar3 = 0;
    do {
      lVar2 = lVar3;
      if ((int)lVar2 == 0x1000) goto LAB_00108cb9;
      local_2038[lVar2] = cVar5;
      cVar5 = source_path[lVar2 + 1];
      lVar3 = lVar2 + 1;
    } while (cVar5 != '\0');
    if ((int)(lVar2 + 1) == 0x1000) {
LAB_00108cb9:
      pcVar6 = "failed to copy path";
      goto LAB_00108da1;
    }
    pcVar6 = local_2038 + lVar2 + 1;
  }
  *pcVar6 = '\0';
  if (build_root_size < 1) {
    __assert_fail("build_root_size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marcel303[P]chibi/chibi.cpp"
                  ,0x59e,"bool find_chibi_build_root(const char *, char *, const int)");
  }
  *build_root = '\0';
  bVar1 = chibi::concat(&local_1038,0x1000,local_2038,"/chibi-root.txt",(char *)0x0,(char *)0x0);
  pcVar6 = "failed to create absolute path";
  if (bVar1) {
    do {
      bVar1 = file_exist(&local_1038);
      if (bVar1) {
        pcVar4 = build_root;
        if (local_1038 != '\0') {
          lVar3 = 0;
          cVar5 = local_1038;
          do {
            if (build_root_size == (int)lVar3) goto LAB_00108d93;
            build_root[lVar3] = cVar5;
            cVar5 = acStack_1037[lVar3];
            lVar3 = lVar3 + 1;
          } while (cVar5 != '\0');
          if (build_root_size == (int)lVar3) {
LAB_00108d93:
            pcVar6 = "failed to copy path";
            break;
          }
          pcVar4 = build_root + lVar3;
        }
        *pcVar4 = '\0';
      }
      pcVar4 = strrchr(local_2038,0x2f);
      if (pcVar4 == (char *)0x0) {
        return *build_root != '\0';
      }
      *pcVar4 = '\0';
      bVar1 = chibi::concat(&local_1038,0x1000,local_2038,"/chibi-root.txt",(char *)0x0,(char *)0x0)
      ;
    } while (bVar1);
  }
LAB_00108da1:
  report_error((char *)0x0,pcVar6);
  return false;
}

Assistant:

bool find_chibi_build_root(const char * source_path, char * build_root, const int build_root_size)
{
	// recursively find build_root
	
	char current_path[PATH_MAX];
	if (!copy_string(current_path, sizeof(current_path), source_path))
	{
		report_error(nullptr, "failed to copy path");
		return false;
	}
	
	assert(build_root_size > 0);
	build_root[0] = 0;

	for (;;)
	{
		char root_path[PATH_MAX];
		if (!concat(root_path, sizeof(root_path), current_path, "/chibi-root.txt"))
		{
			report_error(nullptr, "failed to create absolute path");
			return false;
		}

		if (file_exist(root_path))
		{
			if (!copy_string(build_root, build_root_size, root_path))
			{
				report_error(nullptr, "failed to copy path");
				return false;
			}
		}
		
		char * term = strrchr(current_path, '/');

		if (term == nullptr)
			break;
		else
			*term = 0;
	}
	
	if (build_root[0] == 0)
		return false;
	
	return true;
}